

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O2

void __thiscall
xray_re::_lzhuf::Encode
          (_lzhuf *this,uint8_t **_code,size_t *_codesize,uint8_t *_text,size_t _textsize)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint r;
  uint uVar8;
  FILE *pFVar9;
  uint p;
  int iVar10;
  int iVar11;
  
  this->m_src_limit = _textsize;
  this->m_src_pos = 0;
  this->m_src = _text;
  this->m_dest_limit = _textsize >> 1;
  this->m_dest_pos = 4;
  pFVar9 = (FILE *)_code;
  puVar3 = (uint8_t *)malloc(_textsize >> 1);
  this->m_dest = puVar3;
  *(int *)puVar3 = (int)_textsize;
  this->putbuf = 0;
  this->putlen = '\0';
  StartHuff(this);
  InitTree(this);
  for (lVar4 = 0; lVar4 != 0xfc4; lVar4 = lVar4 + 1) {
    this->text_buf[lVar4] = ' ';
  }
  for (uVar7 = 0; uVar7 != 0x3c; uVar7 = uVar7 + 1) {
    iVar1 = getc(this,pFVar9);
    if (iVar1 < 0) goto LAB_00161315;
    *(char *)((long)this->lson + (uVar7 - 0x80)) = (char)iVar1;
  }
  uVar7 = 0x3c;
LAB_00161315:
  this->textsize = uVar7 & 0xffffffff;
  for (iVar1 = 0xfc3; iVar1 != 0xf87; iVar1 = iVar1 + -1) {
    InsertNode(this,iVar1);
  }
  r = 0xfc4;
  InsertNode(this,0xfc4);
  p = 0;
  do {
    uVar6 = (uint)uVar7;
    uVar8 = this->match_length;
    if ((int)uVar6 < this->match_length) {
      this->match_length = uVar6;
      uVar8 = uVar6;
    }
    if ((int)uVar8 < 3) {
      this->match_length = 1;
      pFVar9 = (FILE *)(ulong)this->text_buf[(int)r];
      EncodeChar(this,(uint)this->text_buf[(int)r]);
    }
    else {
      EncodeChar(this,uVar8 + 0xfd);
      pFVar9 = (FILE *)(ulong)(uint)this->match_position;
      EncodePosition(this,this->match_position);
    }
    iVar1 = this->match_length;
    iVar10 = 0;
    iVar5 = 0;
    if (0 < iVar1) {
      iVar10 = iVar1;
      iVar5 = 0;
    }
    while ((iVar11 = iVar10, iVar10 != iVar5 &&
           (iVar2 = getc(this,pFVar9), iVar11 = iVar5, -1 < iVar2))) {
      DeleteNode(this,p);
      this->text_buf[(int)p] = (uchar)iVar2;
      if (p < 0x3b) {
        *(uchar *)((long)this->lson + (long)(int)p + -0x44) = (uchar)iVar2;
      }
      p = p + 1 & 0xfff;
      r = r + 1 & 0xfff;
      pFVar9 = (FILE *)(ulong)r;
      InsertNode(this,r);
      iVar5 = iVar5 + 1;
    }
    for (; uVar7 = (ulong)uVar6, iVar11 < iVar1; iVar11 = iVar11 + 1) {
      DeleteNode(this,p);
      r = r + 1 & 0xfff;
      if (uVar6 != 1) {
        InsertNode(this,r);
      }
      p = p + 1 & 0xfff;
      uVar6 = uVar6 - 1;
    }
  } while (0 < (int)uVar6);
  EncodeEnd(this);
  *_code = this->m_dest;
  *_codesize = this->m_dest_pos;
  return;
}

Assistant:

void _lzhuf::Encode(uint8_t*& _code, size_t& _codesize, const uint8_t* _text, size_t _textsize)  /* compression */
{
	int i, c, len, r, s, last_match_length;

	m_src_limit = _textsize;
	m_src_pos = 0;
	m_src = _text;

	m_dest_limit = _textsize/2;
	m_dest_pos = 4;
	m_dest = static_cast<uint8_t*>(malloc(m_dest_limit));
	*(uint32_t*)m_dest = uint32_t(_textsize);

	putbuf = 0;
	putlen = 0;

	StartHuff();
	InitTree();
	s = 0;
	r = N - F;
	for (i = s; i < r; i++)
		text_buf[i] = ' ';
	for (len = 0; len < F && (c = getc()) >= 0; len++)
		text_buf[r + len] = c;
	textsize = len;
	for (i = 1; i <= F; i++)
		InsertNode(r - i);
	InsertNode(r);
	do {
		if (match_length > len)
			match_length = len;
		if (match_length <= THRESHOLD) {
			match_length = 1;
			EncodeChar(text_buf[r]);
		} else {
			EncodeChar(255 - THRESHOLD + match_length);
			EncodePosition(match_position);
		}
		last_match_length = match_length;
		for (i = 0; i < last_match_length && (c = getc()) >= 0; i++) {
			DeleteNode(s);
			text_buf[s] = c;
			if (s < F - 1)
				text_buf[s + N] = c;
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			InsertNode(r);
		}
		while (i++ < last_match_length) {
			DeleteNode(s);
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			if (--len) InsertNode(r);
		}
	} while (len > 0);
	EncodeEnd();
	_code = m_dest;
	_codesize = m_dest_pos;
}